

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall jsonnet::internal::ClonePass::expr(ClonePass *this,AST **ast_)

{
  Apply *pAVar1;
  ApplyBrace *pAVar2;
  Array *pAVar3;
  ArrayComprehension *pAVar4;
  Assert *pAVar5;
  Binary *pBVar6;
  BuiltinFunction *pBVar7;
  Conditional *pCVar8;
  DesugaredObject *pDVar9;
  Dollar *pDVar10;
  Error *pEVar11;
  Function *pFVar12;
  Import *pIVar13;
  Importstr *pIVar14;
  Importbin *pIVar15;
  Index *pIVar16;
  InSuper *pIVar17;
  LiteralBoolean *pLVar18;
  LiteralNull *pLVar19;
  LiteralNumber *pLVar20;
  LiteralString *pLVar21;
  Local *pLVar22;
  Object *pOVar23;
  ObjectComprehension *pOVar24;
  ObjectComprehensionSimple *pOVar25;
  Parens *pPVar26;
  Allocator *this_00;
  Self *pSVar27;
  SuperIndex *pSVar28;
  Unary *pUVar29;
  Var *pVVar30;
  ostream *this_01;
  void *this_02;
  long *in_RSI;
  Var *ast_29;
  Unary *ast_28;
  SuperIndex *ast_27;
  Self *ast_26;
  Parens *ast_25;
  ObjectComprehensionSimple *ast_24;
  ObjectComprehension *ast_23;
  Object *ast_22;
  Local *ast_21;
  LiteralString *ast_20;
  LiteralNumber *ast_19;
  LiteralNull *ast_18;
  LiteralBoolean *ast_17;
  InSuper *ast_16;
  Index *ast_15;
  Importbin *ast_14;
  Importstr *ast_13;
  Import *ast_12;
  Function *ast_11;
  Error *ast_10;
  Dollar *ast_9;
  DesugaredObject *ast_8;
  Conditional *ast_7;
  BuiltinFunction *ast_6;
  Binary *ast_5;
  Assert *ast_4;
  ArrayComprehension *ast_3;
  Array *ast_2;
  ApplyBrace *ast_1;
  Apply *ast;
  AST **in_stack_fffffffffffffd08;
  CompilerPass *in_stack_fffffffffffffd10;
  long local_2e0;
  long local_2d0;
  Index *in_stack_fffffffffffffd38;
  Allocator *in_stack_fffffffffffffd40;
  long local_2b0;
  long local_2a0;
  long local_290;
  long local_280;
  long local_270;
  long local_260;
  long local_250;
  long local_240;
  long local_230;
  long local_220;
  long local_210;
  long local_200;
  long local_1f0;
  long local_1e0;
  long local_1d0;
  long local_1c0;
  long local_1b0;
  long local_1a0;
  long local_190;
  long local_180;
  long local_170;
  long local_160;
  long local_150;
  long local_140;
  long local_130;
  long local_120;
  
  switch(*(undefined4 *)(*in_RSI + 0x48)) {
  case 0:
    if (*in_RSI == 0) {
      local_120 = 0;
    }
    else {
      local_120 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Apply::typeinfo,0);
    }
    if (local_120 == 0) {
      __assert_fail("dynamic_cast<Apply *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16b,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pAVar1 = Allocator::clone<jsonnet::internal::Apply>
                       (in_stack_fffffffffffffd40,(Apply *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pAVar1;
    break;
  case 1:
    if (*in_RSI == 0) {
      local_130 = 0;
    }
    else {
      local_130 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    }
    if (local_130 == 0) {
      __assert_fail("dynamic_cast<ApplyBrace *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16c,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pAVar2 = Allocator::clone<jsonnet::internal::ApplyBrace>
                       (in_stack_fffffffffffffd40,(ApplyBrace *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pAVar2;
    break;
  case 2:
    if (*in_RSI == 0) {
      local_140 = 0;
    }
    else {
      local_140 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Array::typeinfo,0);
    }
    if (local_140 == 0) {
      __assert_fail("dynamic_cast<Array *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16d,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pAVar3 = Allocator::clone<jsonnet::internal::Array>
                       (in_stack_fffffffffffffd40,(Array *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pAVar3;
    break;
  case 3:
    if (*in_RSI == 0) {
      local_150 = 0;
    }
    else {
      local_150 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
    }
    if (local_150 == 0) {
      __assert_fail("dynamic_cast<ArrayComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16e,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pAVar4 = Allocator::clone<jsonnet::internal::ArrayComprehension>
                       (in_stack_fffffffffffffd40,(ArrayComprehension *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pAVar4;
    break;
  default:
    this_01 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
    this_02 = (void *)std::ostream::operator<<(this_01,(void *)*in_RSI);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    abort();
  case 5:
    if (*in_RSI == 0) {
      local_160 = 0;
    }
    else {
      local_160 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Assert::typeinfo,0);
    }
    if (local_160 == 0) {
      __assert_fail("dynamic_cast<Assert *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x170,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pAVar5 = Allocator::clone<jsonnet::internal::Assert>
                       (in_stack_fffffffffffffd40,(Assert *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pAVar5;
    break;
  case 6:
    if (*in_RSI == 0) {
      local_170 = 0;
    }
    else {
      local_170 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Binary::typeinfo,0);
    }
    if (local_170 == 0) {
      __assert_fail("dynamic_cast<Binary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x171,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pBVar6 = Allocator::clone<jsonnet::internal::Binary>
                       (in_stack_fffffffffffffd40,(Binary *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pBVar6;
    break;
  case 7:
    if (*in_RSI == 0) {
      local_180 = 0;
    }
    else {
      local_180 = __dynamic_cast(*in_RSI,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
    }
    if (local_180 == 0) {
      __assert_fail("dynamic_cast<BuiltinFunction *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x172,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pBVar7 = Allocator::clone<jsonnet::internal::BuiltinFunction>
                       (in_stack_fffffffffffffd40,(BuiltinFunction *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pBVar7;
    break;
  case 8:
    if (*in_RSI == 0) {
      local_190 = 0;
    }
    else {
      local_190 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Conditional::typeinfo,0);
    }
    if (local_190 == 0) {
      __assert_fail("dynamic_cast<Conditional *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x173,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pCVar8 = Allocator::clone<jsonnet::internal::Conditional>
                       (in_stack_fffffffffffffd40,(Conditional *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pCVar8;
    break;
  case 9:
    if (*in_RSI == 0) {
      local_1a0 = 0;
    }
    else {
      local_1a0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&DesugaredObject::typeinfo,0);
    }
    if (local_1a0 == 0) {
      __assert_fail("dynamic_cast<DesugaredObject *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x174,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pDVar9 = Allocator::clone<jsonnet::internal::DesugaredObject>
                       (in_stack_fffffffffffffd40,(DesugaredObject *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pDVar9;
    break;
  case 10:
    if (*in_RSI == 0) {
      local_1b0 = 0;
    }
    else {
      local_1b0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Dollar::typeinfo,0);
    }
    if (local_1b0 == 0) {
      __assert_fail("dynamic_cast<Dollar *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x175,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pDVar10 = Allocator::clone<jsonnet::internal::Dollar>
                        (in_stack_fffffffffffffd40,(Dollar *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pDVar10;
    break;
  case 0xb:
    if (*in_RSI == 0) {
      local_1c0 = 0;
    }
    else {
      local_1c0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Error::typeinfo,0);
    }
    if (local_1c0 == 0) {
      __assert_fail("dynamic_cast<Error *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x176,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pEVar11 = Allocator::clone<jsonnet::internal::Error>
                        (in_stack_fffffffffffffd40,(Error *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pEVar11;
    break;
  case 0xc:
    if (*in_RSI == 0) {
      local_1d0 = 0;
    }
    else {
      local_1d0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Function::typeinfo,0);
    }
    if (local_1d0 == 0) {
      __assert_fail("dynamic_cast<Function *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x177,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pFVar12 = Allocator::clone<jsonnet::internal::Function>
                        (in_stack_fffffffffffffd40,(Function *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pFVar12;
    break;
  case 0xd:
    if (*in_RSI == 0) {
      local_1e0 = 0;
    }
    else {
      local_1e0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Import::typeinfo,0);
    }
    if (local_1e0 == 0) {
      __assert_fail("dynamic_cast<Import *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x178,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar13 = Allocator::clone<jsonnet::internal::Import>
                        (in_stack_fffffffffffffd40,(Import *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pIVar13;
    break;
  case 0xe:
    if (*in_RSI == 0) {
      local_1f0 = 0;
    }
    else {
      local_1f0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Importstr::typeinfo,0);
    }
    if (local_1f0 == 0) {
      __assert_fail("dynamic_cast<Importstr *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x179,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar14 = Allocator::clone<jsonnet::internal::Importstr>
                        (in_stack_fffffffffffffd40,(Importstr *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pIVar14;
    break;
  case 0xf:
    if (*in_RSI == 0) {
      local_200 = 0;
    }
    else {
      local_200 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Importbin::typeinfo,0);
    }
    if (local_200 == 0) {
      __assert_fail("dynamic_cast<Importbin *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17a,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar15 = Allocator::clone<jsonnet::internal::Importbin>
                        (in_stack_fffffffffffffd40,(Importbin *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pIVar15;
    break;
  case 0x10:
    if (*in_RSI == 0) {
      local_210 = 0;
    }
    else {
      local_210 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Index::typeinfo,0);
    }
    if (local_210 == 0) {
      __assert_fail("dynamic_cast<Index *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17b,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar16 = Allocator::clone<jsonnet::internal::Index>
                        (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    *in_RSI = (long)pIVar16;
    break;
  case 0x11:
    if (*in_RSI == 0) {
      local_220 = 0;
    }
    else {
      local_220 = __dynamic_cast(*in_RSI,&AST::typeinfo,&InSuper::typeinfo,0);
    }
    if (local_220 == 0) {
      __assert_fail("dynamic_cast<InSuper *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17c,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar17 = Allocator::clone<jsonnet::internal::InSuper>
                        (in_stack_fffffffffffffd40,(InSuper *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pIVar17;
    break;
  case 0x12:
    if (*in_RSI == 0) {
      local_230 = 0;
    }
    else {
      local_230 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
    }
    if (local_230 == 0) {
      __assert_fail("dynamic_cast<LiteralBoolean *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17d,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pLVar18 = Allocator::clone<jsonnet::internal::LiteralBoolean>
                        (in_stack_fffffffffffffd40,(LiteralBoolean *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pLVar18;
    break;
  case 0x13:
    if (*in_RSI == 0) {
      local_240 = 0;
    }
    else {
      local_240 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralNull::typeinfo,0);
    }
    if (local_240 == 0) {
      __assert_fail("dynamic_cast<LiteralNull *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17e,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pLVar19 = Allocator::clone<jsonnet::internal::LiteralNull>
                        (in_stack_fffffffffffffd40,(LiteralNull *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pLVar19;
    break;
  case 0x14:
    if (*in_RSI == 0) {
      local_250 = 0;
    }
    else {
      local_250 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralNumber::typeinfo,0);
    }
    if (local_250 == 0) {
      __assert_fail("dynamic_cast<LiteralNumber *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17f,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pLVar20 = Allocator::clone<jsonnet::internal::LiteralNumber>
                        (in_stack_fffffffffffffd40,(LiteralNumber *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pLVar20;
    break;
  case 0x15:
    if (*in_RSI == 0) {
      local_260 = 0;
    }
    else {
      local_260 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralString::typeinfo,0);
    }
    if (local_260 == 0) {
      __assert_fail("dynamic_cast<LiteralString *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x180,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pLVar21 = Allocator::clone<jsonnet::internal::LiteralString>
                        (in_stack_fffffffffffffd40,(LiteralString *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pLVar21;
    break;
  case 0x16:
    if (*in_RSI == 0) {
      local_270 = 0;
    }
    else {
      local_270 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Local::typeinfo,0);
    }
    if (local_270 == 0) {
      __assert_fail("dynamic_cast<Local *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x181,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pLVar22 = Allocator::clone<jsonnet::internal::Local>
                        (in_stack_fffffffffffffd40,(Local *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pLVar22;
    break;
  case 0x17:
    if (*in_RSI == 0) {
      local_280 = 0;
    }
    else {
      local_280 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Object::typeinfo,0);
    }
    if (local_280 == 0) {
      __assert_fail("dynamic_cast<Object *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x182,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pOVar23 = Allocator::clone<jsonnet::internal::Object>
                        (in_stack_fffffffffffffd40,(Object *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pOVar23;
    break;
  case 0x18:
    if (*in_RSI == 0) {
      local_290 = 0;
    }
    else {
      local_290 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ObjectComprehension::typeinfo,0);
    }
    if (local_290 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x183,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pOVar24 = Allocator::clone<jsonnet::internal::ObjectComprehension>
                        (in_stack_fffffffffffffd40,(ObjectComprehension *)in_stack_fffffffffffffd38)
    ;
    *in_RSI = (long)pOVar24;
    break;
  case 0x19:
    if (*in_RSI == 0) {
      local_2a0 = 0;
    }
    else {
      local_2a0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
    }
    if (local_2a0 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehensionSimple *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x184,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pOVar25 = Allocator::clone<jsonnet::internal::ObjectComprehensionSimple>
                        (in_stack_fffffffffffffd40,
                         (ObjectComprehensionSimple *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pOVar25;
    break;
  case 0x1a:
    if (*in_RSI == 0) {
      local_2b0 = 0;
    }
    else {
      local_2b0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Parens::typeinfo,0);
    }
    if (local_2b0 == 0) {
      __assert_fail("dynamic_cast<Parens *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x185,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pPVar26 = Allocator::clone<jsonnet::internal::Parens>
                        (in_stack_fffffffffffffd40,(Parens *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pPVar26;
    break;
  case 0x1b:
    if (*in_RSI == 0) {
      this_00 = (Allocator *)0x0;
    }
    else {
      this_00 = (Allocator *)__dynamic_cast(*in_RSI,&AST::typeinfo,&Self::typeinfo,0);
    }
    if (this_00 == (Allocator *)0x0) {
      __assert_fail("dynamic_cast<Self *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x186,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pSVar27 = Allocator::clone<jsonnet::internal::Self>(this_00,(Self *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pSVar27;
    break;
  case 0x1c:
    pSVar28 = (SuperIndex *)*in_RSI;
    if (pSVar28 == (SuperIndex *)0x0) {
      local_2d0 = 0;
    }
    else {
      local_2d0 = __dynamic_cast(pSVar28,&AST::typeinfo,&SuperIndex::typeinfo,0);
    }
    if (local_2d0 == 0) {
      __assert_fail("dynamic_cast<SuperIndex *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x187,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pSVar28 = Allocator::clone<jsonnet::internal::SuperIndex>(in_stack_fffffffffffffd40,pSVar28);
    *in_RSI = (long)pSVar28;
    break;
  case 0x1d:
    if (*in_RSI == 0) {
      local_2e0 = 0;
    }
    else {
      local_2e0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Unary::typeinfo,0);
    }
    if (local_2e0 == 0) {
      __assert_fail("dynamic_cast<Unary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x188,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pUVar29 = Allocator::clone<jsonnet::internal::Unary>
                        (in_stack_fffffffffffffd40,(Unary *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pUVar29;
    break;
  case 0x1e:
    if (*in_RSI == 0) {
      in_stack_fffffffffffffd10 = (CompilerPass *)0x0;
    }
    else {
      in_stack_fffffffffffffd10 =
           (CompilerPass *)__dynamic_cast(*in_RSI,&AST::typeinfo,&Var::typeinfo,0);
    }
    if (in_stack_fffffffffffffd10 == (CompilerPass *)0x0) {
      __assert_fail("dynamic_cast<Var *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x189,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pVVar30 = Allocator::clone<jsonnet::internal::Var>
                        (in_stack_fffffffffffffd40,(Var *)in_stack_fffffffffffffd38);
    *in_RSI = (long)pVVar30;
  }
  CompilerPass::expr(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  return;
}

Assistant:

void ClonePass::expr(AST *&ast_)
{
    switch(ast_->type) {
        CLONE(ast_, AST_APPLY, Apply);
        CLONE(ast_, AST_APPLY_BRACE, ApplyBrace);
        CLONE(ast_, AST_ARRAY, Array);
        CLONE(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehension);
        // CLONE(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehensionSimple);
        CLONE(ast_, AST_ASSERT, Assert);
        CLONE(ast_, AST_BINARY, Binary);
        CLONE(ast_, AST_BUILTIN_FUNCTION, BuiltinFunction);
        CLONE(ast_, AST_CONDITIONAL, Conditional);
        CLONE(ast_, AST_DESUGARED_OBJECT, DesugaredObject);
        CLONE(ast_, AST_DOLLAR, Dollar);
        CLONE(ast_, AST_ERROR, Error);
        CLONE(ast_, AST_FUNCTION, Function);
        CLONE(ast_, AST_IMPORT, Import);
        CLONE(ast_, AST_IMPORTSTR, Importstr);
        CLONE(ast_, AST_IMPORTBIN, Importbin);
        CLONE(ast_, AST_INDEX, Index);
        CLONE(ast_, AST_IN_SUPER, InSuper);
        CLONE(ast_, AST_LITERAL_BOOLEAN, LiteralBoolean);
        CLONE(ast_, AST_LITERAL_NULL, LiteralNull);
        CLONE(ast_, AST_LITERAL_NUMBER, LiteralNumber);
        CLONE(ast_, AST_LITERAL_STRING, LiteralString);
        CLONE(ast_, AST_LOCAL, Local);
        CLONE(ast_, AST_OBJECT, Object);
        CLONE(ast_, AST_OBJECT_COMPREHENSION, ObjectComprehension);
        CLONE(ast_, AST_OBJECT_COMPREHENSION_SIMPLE, ObjectComprehensionSimple);
        CLONE(ast_, AST_PARENS, Parens);
        CLONE(ast_, AST_SELF, Self);
        CLONE(ast_, AST_SUPER_INDEX, SuperIndex);
        CLONE(ast_, AST_UNARY, Unary);
        CLONE(ast_, AST_VAR, Var);
        default:
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
            break;
    }

    CompilerPass::expr(ast_);
}